

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

void Abc_FlowRetime_ConstrainExactAll(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void **__ptr;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      if (pVVar2->pArray[lVar3] != (void *)0x0) {
        uVar1 = *(uint *)((long)pVVar2->pArray[lVar3] + 0x10);
        if (pManMR->vTimeEdges[uVar1].nSize != 0) {
          pVVar2 = pManMR->vTimeEdges + uVar1;
          __ptr = pVVar2->pArray;
          pVVar2->nCap = 0;
          pVVar2->nSize = 0;
          pVVar2->pArray = (void **)0x0;
          if (__ptr != (void **)0x0) {
            free(__ptr);
          }
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  pManMR->nExactConstraints = 0;
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar2->pArray[lVar3];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 8)) {
        if (((undefined1  [24])
             ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x90) ==
             (undefined1  [24])0x80) && (pManMR->vTimeEdges[(uint)pObj->Id].nSize == 0)) {
          Abc_FlowRetime_ConstrainExact(pObj);
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExactAll( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;
  void *pArray;
  
  // free existing constraints
  Abc_NtkForEachObj( pNtk, pObj, i )    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  pManMR->nExactConstraints = 0;
  
  // generate all constraints
  Abc_NtkForEachObj(pNtk, pObj, i)
    if (!Abc_ObjIsLatch(pObj) && FTEST( pObj, CONSERVATIVE ) && !FTEST( pObj, BLOCK ))
      if (!Vec_PtrSize( FTIMEEDGES( pObj ) ))
        Abc_FlowRetime_ConstrainExact( pObj );
}